

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.c
# Opt level: O0

int fiobj_iseq____internal_complex__(FIOBJ o,FIOBJ o2)

{
  int iVar1;
  size_t sVar2;
  fiobj_object_vtable_s *pfVar3;
  uintptr_t uVar4;
  undefined1 local_80 [8];
  fiobj_stack_s queue;
  fiobj_stack_s right;
  fiobj_stack_s left;
  FIOBJ o2_local;
  FIOBJ o_local;
  
  left.arry = (FIOBJ *)o2;
  o2_local = o;
  memset(&right.arry,0,0x20);
  memset(&queue.arry,0,0x20);
  memset(local_80,0,0x20);
  while( true ) {
    fiobj_each1(o2_local,0,fiobj_iseq____internal_complex__task,&right.arry);
    fiobj_each1((FIOBJ)left.arry,0,fiobj_iseq____internal_complex__task,&queue.arry);
    while (sVar2 = fiobj_stack_count((fiobj_stack_s *)&right.arry), sVar2 != 0) {
      o2_local = 0;
      left.arry = (FIOBJ *)0x0;
      fiobj_stack_pop((fiobj_stack_s *)&right.arry,&o2_local);
      fiobj_stack_pop((fiobj_stack_s *)&queue.arry,(FIOBJ *)&left.arry);
      iVar1 = fiobj_iseq_simple(o2_local,(FIOBJ)left.arry);
      if (iVar1 == 0) goto LAB_0016fb91;
      if ((((o2_local != 0) && ((o2_local & 1) == 0)) && ((o2_local & 6) != 6)) &&
         (pfVar3 = fiobj_type_vtable(o2_local),
         pfVar3->each != (_func_size_t_FIOBJ_size_t__func_int_FIOBJ_void_ptr_ptr_void_ptr *)0x0)) {
        pfVar3 = fiobj_type_vtable(o2_local);
        uVar4 = (*pfVar3->count)(o2_local);
        if (uVar4 != 0) {
          fiobj_stack_push((fiobj_stack_s *)local_80,o2_local);
          fiobj_stack_push((fiobj_stack_s *)local_80,(FIOBJ)left.arry);
        }
      }
    }
    o2_local = 0;
    left.arry = (FIOBJ *)0x0;
    fiobj_stack_pop((fiobj_stack_s *)local_80,(FIOBJ *)&left.arry);
    fiobj_stack_pop((fiobj_stack_s *)local_80,&o2_local);
    iVar1 = fiobj_iseq_simple(o2_local,(FIOBJ)left.arry);
    if (iVar1 == 0) break;
    if (o2_local == 0) {
      fiobj_stack_free((fiobj_stack_s *)&right.arry);
      fiobj_stack_free((fiobj_stack_s *)&queue.arry);
      fiobj_stack_free((fiobj_stack_s *)local_80);
      return 1;
    }
  }
LAB_0016fb91:
  fiobj_stack_free((fiobj_stack_s *)&right.arry);
  fiobj_stack_free((fiobj_stack_s *)&queue.arry);
  fiobj_stack_free((fiobj_stack_s *)local_80);
  return 0;
}

Assistant:

int fiobj_iseq____internal_complex__(FIOBJ o, FIOBJ o2) {
  // if (FIOBJECT2VTBL(o)->each && FIOBJECT2VTBL(o)->count(o))
  //   return int fiobj_iseq____internal_complex__(const FIOBJ o, const FIOBJ
  //   o2);
  fiobj_stack_s left = FIO_ARY_INIT, right = FIO_ARY_INIT, queue = FIO_ARY_INIT;
  do {
    fiobj_each1(o, 0, fiobj_iseq____internal_complex__task, &left);
    fiobj_each1(o2, 0, fiobj_iseq____internal_complex__task, &right);
    while (fiobj_stack_count(&left)) {
      o = FIOBJ_INVALID;
      o2 = FIOBJ_INVALID;
      fiobj_stack_pop(&left, &o);
      fiobj_stack_pop(&right, &o2);
      if (!fiobj_iseq_simple(o, o2))
        goto unequal;
      if (FIOBJ_IS_ALLOCATED(o) && FIOBJECT2VTBL(o)->each &&
          FIOBJECT2VTBL(o)->count(o)) {
        fiobj_stack_push(&queue, o);
        fiobj_stack_push(&queue, o2);
      }
    }
    o = FIOBJ_INVALID;
    o2 = FIOBJ_INVALID;
    fiobj_stack_pop(&queue, &o2);
    fiobj_stack_pop(&queue, &o);
    if (!fiobj_iseq_simple(o, o2))
      goto unequal;
  } while (o);
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 1;
unequal:
  fiobj_stack_free(&left);
  fiobj_stack_free(&right);
  fiobj_stack_free(&queue);
  return 0;
}